

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  VirtualInterfaceTypeSyntax *pVVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  ParameterValueAssignmentSyntax *local_50;
  DotMemberClauseSyntax *local_48;
  Token local_40;
  Token local_30;
  Token local_20;
  
  local_20 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x38),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x48) == (SyntaxNode *)0x0) {
    local_50 = (ParameterValueAssignmentSyntax *)0x0;
  }
  else {
    local_50 = (ParameterValueAssignmentSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x48),(DeepCloneVisitor *)&local_50,
                          (BumpAllocator *)__child_stack);
  }
  if (*(SyntaxNode **)(__fn + 0x50) == (SyntaxNode *)0x0) {
    local_48 = (DotMemberClauseSyntax *)0x0;
  }
  else {
    local_48 = (DotMemberClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x50),(DeepCloneVisitor *)&local_48,
                          (BumpAllocator *)__child_stack);
  }
  pVVar1 = BumpAllocator::
           emplace<slang::syntax::VirtualInterfaceTypeSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ParameterValueAssignmentSyntax*,slang::syntax::DotMemberClauseSyntax*>
                     ((BumpAllocator *)__child_stack,&local_20,&local_30,&local_40,&local_50,
                      &local_48);
  return (int)pVVar1;
}

Assistant:

static SyntaxNode* clone(const VirtualInterfaceTypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<VirtualInterfaceTypeSyntax>(
        node.virtualKeyword.deepClone(alloc),
        node.interfaceKeyword.deepClone(alloc),
        node.name.deepClone(alloc),
        node.parameters ? deepClone(*node.parameters, alloc) : nullptr,
        node.modport ? deepClone(*node.modport, alloc) : nullptr
    );
}